

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O3

string * __thiscall
duckdb::StringStats::Min_abi_cxx11_
          (string *__return_storage_ptr__,StringStats *this,BaseStatistics *stats)

{
  long lVar1;
  StringStats *pSVar2;
  
  pSVar2 = this + 0x28;
  lVar1 = 0;
  do {
    if (pSVar2[lVar1] == (StringStats)0x0) goto LAB_005f4380;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  lVar1 = 8;
LAB_005f4380:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pSVar2,pSVar2 + lVar1);
  return __return_storage_ptr__;
}

Assistant:

string StringStats::Min(const BaseStatistics &stats) {
	return GetStringMinMaxValue(StringStats::GetDataUnsafe(stats).min);
}